

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor_tmpl_impl.hpp
# Opt level: O1

AVisitor<hiberlite::LoadBean> * __thiscall
hiberlite::AVisitor<hiberlite::LoadBean>::operator&
          (AVisitor<hiberlite::LoadBean> *this,
          collection_nvp<int,_hiberlite::stl_stream_adapter<int,_std::vector<int,_std::allocator<int>_>_>_>
          *nvp)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  LoadBean *this_00;
  pointer pcVar2;
  collection_nvp<int,_hiberlite::stl_stream_adapter<int,_std::vector<int,_std::allocator<int>_>_>_>
  local_60;
  
  this_00 = this->actor;
  paVar1 = &local_60.name.field_2;
  pcVar2 = (nvp->name)._M_dataplus._M_p;
  local_60.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar2,pcVar2 + (nvp->name)._M_string_length);
  local_60.stream.xx = (nvp->stream).xx;
  local_60.stream._20_4_ = *(undefined4 *)&(nvp->stream).field_0x14;
  local_60.stream.ct = (nvp->stream).ct;
  local_60.stream.it._M_current = (nvp->stream).it._M_current;
  LoadBean::
  act<hiberlite::AVisitor<hiberlite::LoadBean>,int,hiberlite::stl_stream_adapter<int,std::vector<int,std::allocator<int>>>>
            (this_00,this,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_60.name._M_dataplus._M_p);
  }
  return this;
}

Assistant:

AVisitor<C>& AVisitor<C>::operator&(collection_nvp<E,S> nvp)
{
	actor->act(*this,nvp);
	return *this;
}